

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-close.c
# Opt level: O0

int run_test_poll_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_2118 [4];
  int i;
  uv_poll_t poll_handles [64];
  uv_os_sock_t sockets [64];
  
  for (eval_a._4_4_ = 0; eval_a._4_4_ < 0x40; eval_a._4_4_ = eval_a._4_4_ + 1) {
    iVar1 = socket(2,1,0);
    sockets[(long)eval_a._4_4_ + -2] = iVar1;
    puVar2 = uv_default_loop();
    uv_poll_init(puVar2,(uv_poll_t *)(local_2118 + (long)eval_a._4_4_ * 0x80),
                 sockets[(long)eval_a._4_4_ + -2]);
    uv_poll_start((uv_poll_t *)(local_2118 + (long)eval_a._4_4_ * 0x80),3,(uv_poll_cb)0x0);
  }
  for (eval_a._4_4_ = 0; eval_a._4_4_ < 0x40; eval_a._4_4_ = eval_a._4_4_ + 1) {
    uv_close((uv_handle_t *)(local_2118 + (long)eval_a._4_4_ * 0x80),close_cb);
  }
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)close_cb_called != 0x40) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-close.c"
            ,0x45,"close_cb_called","==","64",(long)close_cb_called,"==",0x40);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-close.c"
            ,0x47,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(poll_close) {
  uv_os_sock_t sockets[NUM_SOCKETS];
  uv_poll_t poll_handles[NUM_SOCKETS];
  int i;

#ifdef _WIN32
  {
    struct WSAData wsa_data;
    int r = WSAStartup(MAKEWORD(2, 2), &wsa_data);
    ASSERT_OK(r);
  }
#endif

  for (i = 0; i < NUM_SOCKETS; i++) {
    sockets[i] = socket(AF_INET, SOCK_STREAM, 0);
    uv_poll_init(uv_default_loop(), &poll_handles[i], sockets[i]);
    uv_poll_start(&poll_handles[i], UV_READABLE | UV_WRITABLE, NULL);
  }

  for (i = 0; i < NUM_SOCKETS; i++) {
    uv_close((uv_handle_t*) &poll_handles[i], close_cb);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(close_cb_called, NUM_SOCKETS);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}